

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::setReverbEnabled(Synth *this,bool newReverbEnabled)

{
  bool bVar1;
  bool oldReverbOverridden;
  bool newReverbEnabled_local;
  Synth *this_local;
  
  if (((this->opened & 1U) != 0) && (bVar1 = isReverbEnabled(this), bVar1 != newReverbEnabled)) {
    if (newReverbEnabled) {
      bVar1 = this->reverbOverridden;
      this->reverbOverridden = false;
      refreshSystemReverbParameters(this);
      this->reverbOverridden = (bool)(bVar1 & 1);
    }
    else {
      if ((this->extensions->preallocatedReverbMemory & 1U) == 0) {
        (*this->reverbModel->_vptr_BReverbModel[4])();
      }
      this->reverbModel = (BReverbModel *)0x0;
    }
  }
  return;
}

Assistant:

void Synth::setReverbEnabled(bool newReverbEnabled) {
	if (!opened) return;
	if (isReverbEnabled() == newReverbEnabled) return;
	if (newReverbEnabled) {
		bool oldReverbOverridden = reverbOverridden;
		reverbOverridden = false;
		refreshSystemReverbParameters();
		reverbOverridden = oldReverbOverridden;
	} else {
		if (!extensions.preallocatedReverbMemory) {
			reverbModel->close();
		}
		reverbModel = NULL;
	}
}